

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::oper_rhs<int>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_lhs,Boxed_Value *t_rhs)

{
  Common_Types CVar1;
  bad_any_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  type tVar3;
  Boxed_Value BVar4;
  
  CVar1 = get_common_type(t_rhs);
  switch(CVar1) {
  case t_int32:
    tVar3 = go<int,int>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_double:
    tVar3 = go<int,double>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint8:
    tVar3 = go<int,unsigned_char>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_int8:
    tVar3 = go<int,signed_char>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint16:
    tVar3 = go<int,unsigned_short>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_int16:
    tVar3 = go<int,short>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint32:
    tVar3 = go<int,unsigned_int>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint64:
    tVar3 = go<int,unsigned_long>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_int64:
    tVar3 = go<int,long>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_float:
    tVar3 = go<int,float>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_long_double:
    tVar3 = go<int,long_double>(this,t_oper,t_lhs,t_rhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline static Boxed_Value oper_rhs(Operators::Opers t_oper, const Boxed_Value &t_lhs, const Boxed_Value &t_rhs)
        {
          switch (get_common_type(t_rhs)) {
            case Common_Types::t_int32:
              return go<LHS, int32_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_uint8:
              return go<LHS, uint8_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_int8:
              return go<LHS, int8_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_uint16:
              return go<LHS, uint16_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_int16:
              return go<LHS, int16_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_uint32:
              return go<LHS, uint32_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_uint64:
              return go<LHS, uint64_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_int64:
              return go<LHS, int64_t>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_double:
              return go<LHS, double>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_float:
              return go<LHS, float>(t_oper, t_lhs, t_rhs);
            case Common_Types::t_long_double:
              return go<LHS, long double>(t_oper, t_lhs, t_rhs);
          }

          throw chaiscript::detail::exception::bad_any_cast();
        }